

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_def.c
# Opt level: O0

void resolve_extension(upb_DefBuilder *ctx,char *prefix,upb_FieldDef *f,
                      google_protobuf_FieldDescriptorProto *field_proto)

{
  uint uVar1;
  char *pcVar2;
  _Bool _Var3;
  upb_MessageDef *m_00;
  char *pcVar4;
  upb_StringView sym;
  upb_MessageDef *m;
  upb_StringView name;
  google_protobuf_FieldDescriptorProto *field_proto_local;
  upb_FieldDef *f_local;
  char *prefix_local;
  upb_DefBuilder *ctx_local;
  
  _Var3 = google_protobuf_FieldDescriptorProto_has_extendee(field_proto);
  if (!_Var3) {
    _upb_DefBuilder_Errf(ctx,"extension for field \'%s\' had no extendee",f->full_name);
  }
  sym = google_protobuf_FieldDescriptorProto_extendee(field_proto);
  m_00 = (upb_MessageDef *)_upb_DefBuilder_Resolve(ctx,f->full_name,prefix,sym,UPB_DEFTYPE_MSG);
  f->msgdef = m_00;
  _Var3 = _upb_MessageDef_IsValidExtensionNumber(m_00,f->number_);
  if (!_Var3) {
    uVar1 = f->number_;
    pcVar2 = f->full_name;
    pcVar4 = upb_MessageDef_FullName(m_00);
    _upb_DefBuilder_Errf
              (ctx,"field number %u in extension %s has no extension range in message %s",
               (ulong)uVar1,pcVar2,pcVar4);
  }
  return;
}

Assistant:

static void resolve_extension(upb_DefBuilder* ctx, const char* prefix,
                              upb_FieldDef* f,
                              const UPB_DESC(FieldDescriptorProto) *
                                  field_proto) {
  if (!UPB_DESC(FieldDescriptorProto_has_extendee)(field_proto)) {
    _upb_DefBuilder_Errf(ctx, "extension for field '%s' had no extendee",
                         f->full_name);
  }

  upb_StringView name = UPB_DESC(FieldDescriptorProto_extendee)(field_proto);
  const upb_MessageDef* m =
      _upb_DefBuilder_Resolve(ctx, f->full_name, prefix, name, UPB_DEFTYPE_MSG);
  f->msgdef = m;

  if (!_upb_MessageDef_IsValidExtensionNumber(m, f->number_)) {
    _upb_DefBuilder_Errf(
        ctx,
        "field number %u in extension %s has no extension range in message %s",
        (unsigned)f->number_, f->full_name, upb_MessageDef_FullName(m));
  }
}